

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O0

int event_track::write_to_segmented_event_track_file
              (string *out_file,
              vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
              *in_emsg_list,uint32_t track_id,uint64_t pt_off_start,uint64_t pt_off_end,string *urn,
              uint64_t seg_duration,uint32_t timescale)

{
  byte bVar1;
  reference pvVar2;
  ostream *poVar3;
  undefined1 local_290 [8];
  vector<event_track::EventSample,_std::allocator<event_track::EventSample>_> samples_in_segment;
  uint64_t actual_duration;
  uint64_t it_time;
  uint64_t current_tfdt;
  ofstream ot;
  undefined1 local_50 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> sparse_moov;
  string *urn_local;
  uint64_t pt_off_end_local;
  uint64_t pt_off_start_local;
  uint32_t track_id_local;
  vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
  *in_emsg_list_local;
  string *out_file_local;
  
  sparse_moov.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)urn;
  base64_decode((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,
                &moov_64_enc_abi_cxx11_);
  fmp4_stream::set_track_id
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,track_id);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,0x1c);
  anon_unknown.dwarf_196ee::fmp4_write_uint32(timescale,(char *)pvVar2);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,0xf4);
  anon_unknown.dwarf_196ee::fmp4_write_uint32(timescale,(char *)pvVar2);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,0x220);
  anon_unknown.dwarf_196ee::fmp4_write_uint32(track_id,(char *)pvVar2);
  set_evte((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  std::ofstream::ofstream(&current_tfdt,(string *)out_file,_S_bin);
  if (seg_duration == 0) {
    seg_duration = pt_off_end - pt_off_start;
  }
  bVar1 = std::ios::good();
  if ((bVar1 & 1) != 0) {
    std::ostream::write((char *)&current_tfdt,0x133890);
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
    std::ostream::write((char *)&current_tfdt,(long)pvVar2);
    actual_duration = pt_off_start;
    while (actual_duration < pt_off_end) {
      samples_in_segment.
      super__Vector_base<event_track::EventSample,_std::allocator<event_track::EventSample>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)seg_duration;
      if (pt_off_end < actual_duration + seg_duration) {
        samples_in_segment.
        super__Vector_base<event_track::EventSample,_std::allocator<event_track::EventSample>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pt_off_end - actual_duration);
      }
      std::vector<event_track::EventSample,_std::allocator<event_track::EventSample>_>::vector
                ((vector<event_track::EventSample,_std::allocator<event_track::EventSample>_> *)
                 local_290);
      find_event_samples(in_emsg_list,
                         (vector<event_track::EventSample,_std::allocator<event_track::EventSample>_>
                          *)local_290,actual_duration,
                         (long)&(samples_in_segment.
                                 super__Vector_base<event_track::EventSample,_std::allocator<event_track::EventSample>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                sample_presentation_time_ + actual_duration,false);
      write_evt_samples_as_fmp4_fragment
                ((vector<event_track::EventSample,_std::allocator<event_track::EventSample>_> *)
                 local_290,(ostream *)&current_tfdt,actual_duration,track_id,
                 (long)&(samples_in_segment.
                         super__Vector_base<event_track::EventSample,_std::allocator<event_track::EventSample>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                        sample_presentation_time_ + actual_duration,0);
      actual_duration =
           (long)&(samples_in_segment.
                   super__Vector_base<event_track::EventSample,_std::allocator<event_track::EventSample>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->sample_presentation_time_ +
           actual_duration;
      std::vector<event_track::EventSample,_std::allocator<event_track::EventSample>_>::~vector
                ((vector<event_track::EventSample,_std::allocator<event_track::EventSample>_> *)
                 local_290);
    }
    bVar1 = std::ios::good();
    if ((bVar1 & 1) != 0) {
      std::ofstream::close();
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"*** wrote sparse track file: ");
    poVar3 = std::operator<<(poVar3,(string *)out_file);
    poVar3 = std::operator<<(poVar3,"  ***");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  std::ofstream::~ofstream(&current_tfdt);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  return 0;
}

Assistant:

int event_track::write_to_segmented_event_track_file(
	const std::string& out_file,
	std::vector<event_track::DASHEventMessageBoxv1> &in_emsg_list,
	uint32_t track_id, 
	uint64_t pt_off_start, 
	uint64_t pt_off_end, 
	const std::string& urn,
	uint64_t seg_duration,
	uint32_t timescale)
{
	std::vector<uint8_t> sparse_moov = base64_decode(moov_64_enc);
	set_track_id(sparse_moov, track_id);
	
	// write back the timescale mvhd / mhd
	fmp4_write_uint32(timescale, (char *)&sparse_moov[28]);
	fmp4_write_uint32(timescale, (char *)&sparse_moov[244]);
	fmp4_write_uint32(track_id, (char*)&sparse_moov[544]);

	event_track::set_evte(sparse_moov);

	std::ofstream ot(out_file, std::ios::binary);
	//cout << sparse_moov.size() << endl;

	if (seg_duration == 0)
		seg_duration = pt_off_end - pt_off_start;

	if (ot.good())
	{
		// write the ftyp header
		ot.write((char *)&sparse_ftyp[0], 20);
		ot.write((const char *)&sparse_moov[0], sparse_moov.size());
		uint64_t current_tfdt = 0;
		uint64_t it_time = pt_off_start;

		while (it_time < pt_off_end)
		{
			uint64_t actual_duration = seg_duration; 
			if (it_time + seg_duration > pt_off_end)
				actual_duration = pt_off_end - it_time;

			std::vector<event_track::EventSample> samples_in_segment;
			find_event_samples(in_emsg_list, samples_in_segment, it_time, it_time + actual_duration);
			event_track::write_evt_samples_as_fmp4_fragment(samples_in_segment, ot, it_time,track_id , it_time + actual_duration);
			it_time +=actual_duration;
		}
		if(ot.good())
		   ot.close();

		std::cout << "*** wrote sparse track file: " << out_file << "  ***" << std::endl;
	}
	return 0;
}